

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O2

void __thiscall
duckdb::PipelineTask::PipelineTask
          (PipelineTask *this,Pipeline *pipeline_p,shared_ptr<duckdb::Event,_true> *event_p)

{
  Executor *executor_p;
  shared_ptr<duckdb::Event,_true> local_28;
  
  executor_p = pipeline_p->executor;
  local_28.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ExecutorTask::ExecutorTask(&this->super_ExecutorTask,executor_p,&local_28);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (this->super_ExecutorTask).super_Task._vptr_Task = (_func_int **)&PTR__PipelineTask_027c5370;
  this->pipeline = pipeline_p;
  (this->pipeline_executor).
  super_unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>._M_t.
  super___uniq_ptr_impl<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::PipelineExecutor_*,_std::default_delete<duckdb::PipelineExecutor>_>
  .super__Head_base<0UL,_duckdb::PipelineExecutor_*,_false>._M_head_impl = (PipelineExecutor *)0x0;
  return;
}

Assistant:

PipelineTask::PipelineTask(Pipeline &pipeline_p, shared_ptr<Event> event_p)
    : ExecutorTask(pipeline_p.executor, std::move(event_p)), pipeline(pipeline_p) {
}